

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client.cpp
# Opt level: O2

void __thiscall miniros::ServiceClient::Impl::~Impl(Impl *this)

{
  int in_EDX;
  int in_ESI;
  
  shutdown(this,in_ESI,in_EDX);
  std::__cxx11::string::~string((string *)&this->service_md5sum_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->header_values_)._M_t);
  std::__cxx11::string::~string((string *)&this->name_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->server_link_).
              super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

ServiceClient::Impl::~Impl()
{
  shutdown();
}